

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * FindWindowNavFocusable(int i_start,int i_stop,int dir)

{
  ImGuiWindow **ppIVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  bool bVar2;
  int i;
  ImGuiContext *g;
  ImGuiContext *this;
  
  this = GImGui;
  while( true ) {
    bVar2 = false;
    if ((-1 < in_EDI) && (bVar2 = false, in_EDI < (this->WindowsFocusOrder).Size)) {
      bVar2 = in_EDI != in_ESI;
    }
    if (!bVar2) break;
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,in_EDI);
    bVar2 = ImGui::IsWindowNavFocusable(*ppIVar1);
    if (bVar2) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)this,in_EDI);
      return *ppIVar1;
    }
    in_EDI = in_EDX + in_EDI;
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

static ImGuiWindow* FindWindowNavFocusable(int i_start, int i_stop, int dir) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = i_start; i >= 0 && i < g.WindowsFocusOrder.Size && i != i_stop; i += dir)
        if (ImGui::IsWindowNavFocusable(g.WindowsFocusOrder[i]))
            return g.WindowsFocusOrder[i];
    return NULL;
}